

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int require_bytes(spng_ctx *ctx,size_t bytes)

{
  int iVar1;
  uchar *puVar2;
  void *pvVar3;
  void *temp_1;
  size_t new_size_1;
  size_t required;
  void *temp;
  size_t new_size;
  size_t bytes_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 0x50;
  }
  else if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
    if ((*(ushort *)&ctx->field_0xcc >> 1 & 1) == 0) {
      ctx_local._4_4_ = 0x53;
    }
    else {
      pvVar3 = (void *)(ctx->bytes_encoded + bytes);
      if (pvVar3 < bytes) {
        ctx_local._4_4_ = 3;
      }
      else {
        if ((void *)ctx->out_png_size < pvVar3) {
          temp_1 = (void *)ctx->out_png_size;
          if (temp_1 < (void *)0x4000) {
            temp_1 = (void *)0x4000;
          }
          for (; temp_1 < pvVar3; temp_1 = (void *)((long)temp_1 << 1)) {
            if (2 < (ulong)temp_1 / 0xffffffffffffffff) {
              iVar1 = encode_err(ctx,3);
              return iVar1;
            }
          }
          puVar2 = (uchar *)spng__realloc(ctx,ctx->out_png,(size_t)temp_1);
          if (puVar2 == (uchar *)0x0) {
            iVar1 = encode_err(ctx,2);
            return iVar1;
          }
          ctx->out_png = puVar2;
          ctx->out_png_size = (size_t)temp_1;
          ctx->write_ptr = ctx->out_png + ctx->bytes_encoded;
        }
        ctx_local._4_4_ = 0;
      }
    }
  }
  else {
    if (ctx->stream_buf_size < bytes) {
      temp = (void *)ctx->stream_buf_size;
      if (temp < (void *)0x200c) {
        temp = (void *)0x200c;
      }
      if (temp < bytes) {
        temp = (void *)bytes;
      }
      puVar2 = (uchar *)spng__realloc(ctx,ctx->stream_buf,(size_t)temp);
      if (puVar2 == (uchar *)0x0) {
        iVar1 = encode_err(ctx,2);
        return iVar1;
      }
      ctx->stream_buf = puVar2;
      ctx->stream_buf_size = bytes;
      ctx->write_ptr = ctx->stream_buf;
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int require_bytes(spng_ctx *ctx, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    if(ctx->streaming)
    {
        if(bytes > ctx->stream_buf_size)
        {
            size_t new_size = ctx->stream_buf_size;

            /* Start at default IDAT size + header + crc */
            if(new_size < (SPNG_WRITE_SIZE + 12)) new_size = SPNG_WRITE_SIZE + 12;

            if(new_size < bytes) new_size = bytes;

            void *temp = spng__realloc(ctx, ctx->stream_buf, new_size);

            if(temp == NULL) return encode_err(ctx, SPNG_EMEM);

            ctx->stream_buf = temp;
            ctx->stream_buf_size = bytes;
            ctx->write_ptr = ctx->stream_buf;
        }

        return 0;
    }

    if(!ctx->internal_buffer) return SPNG_ENODST;

    size_t required = ctx->bytes_encoded + bytes;
    if(required < bytes) return SPNG_EOVERFLOW;

    if(required > ctx->out_png_size)
    {
        size_t new_size = ctx->out_png_size;

        /* Start with a size that doesn't require a realloc() 100% of the time */
        if(new_size < (SPNG_WRITE_SIZE * 2)) new_size = SPNG_WRITE_SIZE * 2;

        /* Prefer the next power of two over the requested size */
        while(new_size < required)
        {
            if(new_size / SIZE_MAX > 2) return encode_err(ctx, SPNG_EOVERFLOW);

            new_size *= 2;
        }

        void *temp = spng__realloc(ctx, ctx->out_png, new_size);

        if(temp == NULL) return encode_err(ctx, SPNG_EMEM);

        ctx->out_png = temp;
        ctx->out_png_size = new_size;
        ctx->write_ptr = ctx->out_png + ctx->bytes_encoded;
    }

    return 0;
}